

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O2

void __thiscall
tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
          (ConstPixelBufferAccess *this,TextureFormat *format,IVec3 *size,void *data)

{
  this->m_format = *format;
  Vector<int,_3>::Vector(&this->m_size,size);
  calculatePackedPitch((tcu *)&this->m_pitch,&this->m_format,&this->m_size);
  this->m_data = data;
  return;
}

Assistant:

ConstPixelBufferAccess::ConstPixelBufferAccess (const TextureFormat& format, const IVec3& size, const void* data)
	: m_format		(format)
	, m_size		(size)
	, m_pitch		(calculatePackedPitch(m_format, m_size))
	, m_data		((void*)data)
{
	DE_ASSERT(isValid(format));
}